

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_name.c
# Opt level: O1

char * rndmonnam(void)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = display_rng(0x271);
  while ((iVar1 < 0x158 &&
         (((mons[iVar1].mflags2 & 0x80000) != 0 || ((mons[iVar1].geno & 0x200) != 0))))) {
    iVar1 = display_rng(0x271);
  }
  if (0x157 < iVar1) {
    return bogusmons_rel + *(int *)(bogusmons_rel + (ulong)(iVar1 - 0x158) * 4);
  }
  pcVar2 = mons_mname(mons + iVar1);
  return pcVar2;
}

Assistant:

const char *rndmonnam(void)
{
	int name;

	do {
	    name = display_rng(SPECIAL_PM + SIZE(bogusmons) - LOW_PM) + LOW_PM;
	} while (name < SPECIAL_PM &&
	    (type_is_pname(&mons[name]) || (mons[name].geno & G_NOGEN)));

	if (name >= SPECIAL_PM) return bogusmons[name - SPECIAL_PM];
	return mons_mname(&mons[name]);
}